

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_http_auth_act(Curl_easy *data)

{
  undefined1 *puVar1;
  uchar uVar2;
  int iVar3;
  uint httpcode;
  connectdata *conn;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  _Bool _Var6;
  char *pcVar7;
  
  pcVar7 = (data->set).str[0x3c];
  iVar3 = (data->req).httpcode;
  if (iVar3 - 100U < 100) {
    return CURLE_OK;
  }
  if (((data->state).field_0x744 & 0x20) != 0) {
    if (((data->set).field_0x8cc & 8) == 0) {
      return CURLE_OK;
    }
    return CURLE_HTTP_RETURNED_ERROR;
  }
  conn = data->conn;
  if (pcVar7 == (char *)0x0 && (data->state).aptr.user == (char *)0x0) {
    _Var5 = false;
  }
  else {
    if (iVar3 != 0x191) {
      _Var5 = false;
      if ((299 < iVar3) || (_Var5 = false, (*(uint *)&(data->req).field_0xd9 & 0x40000) == 0))
      goto LAB_0013231c;
    }
    _Var5 = pickoneauth(&(data->state).authhost,-(ulong)(pcVar7 != (char *)0x0) | 0xffffffffffffffbf
                       );
    if (!_Var5) {
      puVar1 = &(data->state).field_0x744;
      *puVar1 = *puVar1 | 0x20;
    }
    if (((data->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"Forcing HTTP/1.1 for NTLM");
      }
      Curl_conncontrol(conn,1);
      (data->state).httpwant = '\x02';
    }
  }
LAB_0013231c:
  if ((((ulong)conn->bits & 4) == 0) ||
     ((iVar3 = (data->req).httpcode, iVar3 != 0x197 &&
      ((299 < iVar3 || ((*(uint *)&(data->req).field_0xd9 & 0x40000) == 0)))))) {
LAB_00132365:
    if (_Var5 == false) {
      if (((((data->req).httpcode < 300) && (((data->state).authhost.field_0x18 & 1) == 0)) &&
          (((data->req).field_0xdb & 4) != 0)) &&
         ((uVar2 = (data->state).httpreq, uVar2 != '\0' && (uVar2 != '\x05')))) {
        pcVar7 = (*Curl_cstrdup)((data->state).url);
        (data->req).newurl = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        puVar1 = &(data->state).authhost.field_0x18;
        *puVar1 = *puVar1 | 1;
      }
      goto LAB_00132407;
    }
  }
  else {
    _Var6 = pickoneauth(&(data->state).authproxy,0xffffffffffffffbf);
    if (!_Var6) {
      puVar1 = &(data->state).field_0x744;
      *puVar1 = *puVar1 | 0x20;
      goto LAB_00132365;
    }
  }
  http_perhapsrewind(data,conn);
  (*Curl_cfree)((data->req).newurl);
  (data->req).newurl = (char *)0x0;
  pcVar7 = (*Curl_cstrdup)((data->state).url);
  (data->req).newurl = pcVar7;
  if (pcVar7 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_00132407:
  httpcode = (data->req).httpcode;
  _Var5 = http_should_fail(data,httpcode);
  if (_Var5) {
    Curl_failf(data,"The requested URL returned error: %d",(ulong)httpcode);
    return CURLE_HTTP_RETURNED_ERROR;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_auth_act(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!data->set.str[STRING_BEARER])
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && data->req.httpcode <= 199)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((data->state.aptr.user || data->set.str[STRING_BEARER]) &&
     ((data->req.httpcode == 401) ||
      (data->req.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      data->state.httpwant = CURL_HTTP_VERSION_1_1;
    }
  }
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (data->req.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }
#endif

  if(pickhost || pickproxy) {
    result = http_perhapsrewind(data, conn);
    if(result)
      return result;

    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->state.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          data->req.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we did not try HEAD or GET */
    if((data->state.httpreq != HTTPREQ_GET) &&
       (data->state.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->state.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(data, data->req.httpcode)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}